

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implicit_weak_message.h
# Opt level: O1

void __thiscall
google::protobuf::internal::ImplicitWeakMessage::~ImplicitWeakMessage(ImplicitWeakMessage *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ImplicitWeakMessage_00211c98;
  pcVar1 = (this->data_)._M_dataplus._M_p;
  paVar2 = &(this->data_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

class PROTOBUF_EXPORT ImplicitWeakMessage : public MessageLite {
 public:
  ImplicitWeakMessage() {}
  explicit ImplicitWeakMessage(Arena* arena) : MessageLite(arena) {}

  static const ImplicitWeakMessage* default_instance();

  std::string GetTypeName() const override { return ""; }

  MessageLite* New() const override { return new ImplicitWeakMessage; }
  MessageLite* New(Arena* arena) const override {
    return Arena::CreateMessage<ImplicitWeakMessage>(arena);
  }

  void Clear() override { data_.clear(); }

  bool IsInitialized() const override { return true; }

  void CheckTypeAndMergeFrom(const MessageLite& other) override {
    data_.append(static_cast<const ImplicitWeakMessage&>(other).data_);
  }

  const char* _InternalParse(const char* ptr, ParseContext* ctx) final;

  size_t ByteSizeLong() const override { return data_.size(); }

  uint8* _InternalSerialize(uint8* target,
                            io::EpsCopyOutputStream* stream) const final {
    return stream->WriteRaw(data_.data(), static_cast<int>(data_.size()),
                            target);
  }

  int GetCachedSize() const override { return static_cast<int>(data_.size()); }

  typedef void InternalArenaConstructable_;

 private:
  std::string data_;
  GOOGLE_DISALLOW_EVIL_CONSTRUCTORS(ImplicitWeakMessage);
}